

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstest.c
# Opt level: O0

int main(void)

{
  int iVar1;
  bitstream *pbVar2;
  bitstream *nstr;
  int32_t sval;
  uint32_t val;
  bitstream *str;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint32_t *in_stack_ffffffffffffffe0;
  int bytesnum;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  uint uVar4;
  int local_4;
  
  pbVar2 = vs_new_encode((vs_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  iVar1 = vs_start((bitstream *)CONCAT44(0xde,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    iVar1 = vs_u((bitstream *)CONCAT44(0x123,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                 in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      iVar1 = vs_u((bitstream *)CONCAT44(0x456,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                   in_stack_ffffffffffffffdc);
      if (iVar1 == 0) {
        iVar1 = vs_ue((bitstream *)CONCAT44(8,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
        if (iVar1 == 0) {
          iVar1 = vs_ue((bitstream *)CONCAT44(7,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0
                       );
          if (iVar1 == 0) {
            uVar4 = 6;
            iVar1 = vs_ue((bitstream *)CONCAT44(6,in_stack_ffffffffffffffe8),
                          in_stack_ffffffffffffffe0);
            if (iVar1 == 0) {
              iVar1 = vs_se((bitstream *)((ulong)uVar4 << 0x20),(int32_t *)in_stack_ffffffffffffffe0
                           );
              if (iVar1 == 0) {
                iVar1 = vs_se((bitstream *)CONCAT44(uVar4,0xfffffffd),
                              (int32_t *)in_stack_ffffffffffffffe0);
                if (iVar1 == 0) {
                  uVar3 = 3;
                  iVar1 = vs_se((bitstream *)CONCAT44(uVar4,3),(int32_t *)in_stack_ffffffffffffffe0)
                  ;
                  bytesnum = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
                  if (iVar1 == 0) {
                    iVar1 = vs_end((bitstream *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
                    if (iVar1 == 0) {
                      fwrite(pbVar2->bytes,(long)pbVar2->bytesnum,1,_stdout);
                      pbVar2 = vs_new_decode((vs_type)((ulong)pbVar2 >> 0x20),
                                             (uint8_t *)CONCAT44(uVar4,uVar3),bytesnum);
                      iVar1 = vs_start((bitstream *)CONCAT44(uVar4,uVar3),&pbVar2->dir);
                      if (iVar1 == 0) {
                        if (uVar4 == 0xde) {
                          iVar1 = vs_u((bitstream *)CONCAT44(0xde,uVar3),&pbVar2->dir,
                                       in_stack_ffffffffffffffdc);
                          if (iVar1 == 0) {
                            if (uVar4 == 0x123) {
                              iVar1 = vs_u((bitstream *)CONCAT44(0x123,uVar3),&pbVar2->dir,
                                           in_stack_ffffffffffffffdc);
                              if (iVar1 == 0) {
                                if (uVar4 == 0x456) {
                                  iVar1 = vs_ue((bitstream *)CONCAT44(0x456,uVar3),&pbVar2->dir);
                                  if (iVar1 == 0) {
                                    if (uVar4 == 8) {
                                      iVar1 = vs_ue((bitstream *)CONCAT44(8,uVar3),&pbVar2->dir);
                                      if (iVar1 == 0) {
                                        if (uVar4 == 7) {
                                          iVar1 = vs_ue((bitstream *)CONCAT44(7,uVar3),&pbVar2->dir)
                                          ;
                                          if (iVar1 == 0) {
                                            if (uVar4 == 6) {
                                              iVar1 = vs_se((bitstream *)CONCAT44(6,uVar3),
                                                            (int32_t *)pbVar2);
                                              if (iVar1 == 0) {
                                                if (uVar3 == 0) {
                                                  iVar1 = vs_se((bitstream *)((ulong)uVar4 << 0x20),
                                                                (int32_t *)pbVar2);
                                                  if (iVar1 == 0) {
                                                    if (uVar3 == 0xfffffffd) {
                                                      iVar1 = vs_se((bitstream *)
                                                                    CONCAT44(uVar4,0xfffffffd),
                                                                    (int32_t *)pbVar2);
                                                      if (iVar1 == 0) {
                                                        if (uVar3 == 3) {
                                                          iVar1 = vs_end((bitstream *)
                                                                         CONCAT44(
                                                  in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8));
                                                  if (iVar1 == 0) {
                                                    if ((pbVar2->bytepos == pbVar2->bytesnum) &&
                                                       (pbVar2->hasbyte == 0)) {
                                                      fprintf(_stderr,"All ok!\n");
                                                      local_4 = 0;
                                                    }
                                                    else {
                                                      fprintf(_stderr,
                                                  "Bitstream not fully consumed!\n");
                                                  local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"Fail 9: %x\n",(ulong)uVar3);
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"Fail 8: %x\n",(ulong)uVar3);
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                }
                                                else {
                                                  fprintf(_stderr,"Fail 7: %x\n",(ulong)uVar3);
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              fprintf(_stderr,"Fail 6: %x\n",(ulong)uVar4);
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          fprintf(_stderr,"Fail 5: %x\n",(ulong)uVar4);
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      fprintf(_stderr,"Fail 4: %x\n",(ulong)uVar4);
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  fprintf(_stderr,"Fail 3: %x\n",(ulong)uVar4);
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              fprintf(_stderr,"Fail 2: %x\n",(ulong)uVar4);
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"Fail 1\n");
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main() {
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	int32_t sval;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;
	val = 0x123;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x456;
	if (vs_u(str, &val, 12))
		return 1;
	val = 0x8;
	if (vs_ue(str, &val))
		return 1;
	val = 0x7;
	if (vs_ue(str, &val))
		return 1;
	val = 0x6;
	if (vs_ue(str, &val))
		return 1;
	sval = 0;
	if (vs_se(str, &sval))
		return 1;
	sval = -3;
	if (vs_se(str, &sval))
		return 1;
	sval = 3;
	if (vs_se(str, &sval))
		return 1;
	if (vs_end(str))
		return 1;
	fwrite(str->bytes, str->bytesnum, 1, stdout);
	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x123) {
		fprintf (stderr, "Fail 2: %x\n", val);
		return 1;
	}

	if (vs_u(nstr, &val, 12))
		return 1;
	if (val != 0x456) {
		fprintf (stderr, "Fail 3: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x8) {
		fprintf (stderr, "Fail 4: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x7) {
		fprintf (stderr, "Fail 5: %x\n", val);
		return 1;
	}

	if (vs_ue(nstr, &val))
		return 1;
	if (val != 0x6) {
		fprintf (stderr, "Fail 6: %x\n", val);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 0) {
		fprintf (stderr, "Fail 7: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != -3) {
		fprintf (stderr, "Fail 8: %x\n", sval);
		return 1;
	}

	if (vs_se(nstr, &sval))
		return 1;
	if (sval != 3) {
		fprintf (stderr, "Fail 9: %x\n", sval);
		return 1;
	}

	if (vs_end(nstr))
		return 1;
	if (nstr->bytepos != nstr->bytesnum || nstr->hasbyte) {
		fprintf (stderr, "Bitstream not fully consumed!\n");
		return 1;
	}
	fprintf (stderr, "All ok!\n");

	return 0;
}